

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFxu.c
# Opt level: O0

void Abc_NtkFxuFreeInfo(Fxu_Data_t *p)

{
  int local_14;
  int i;
  Fxu_Data_t *p_local;
  
  if (p->vFaninsNew != (Vec_Ptr_t *)0x0) {
    for (local_14 = 0; local_14 < p->vFaninsNew->nSize; local_14 = local_14 + 1) {
      if (p->vFaninsNew->pArray[local_14] != (void *)0x0) {
        Vec_IntFree((Vec_Int_t *)p->vFaninsNew->pArray[local_14]);
      }
    }
  }
  if (p->vSops != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vSops);
  }
  if (p->vSopsNew != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vSopsNew);
  }
  if (p->vFanins != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vFanins);
  }
  if (p->vFaninsNew != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vFaninsNew);
  }
  return;
}

Assistant:

void Abc_NtkFxuFreeInfo( Fxu_Data_t * p )
{
    int i;
    // free the arrays of new fanins
    if ( p->vFaninsNew )
        for ( i = 0; i < p->vFaninsNew->nSize; i++ )
            if ( p->vFaninsNew->pArray[i] )
                Vec_IntFree( (Vec_Int_t *)p->vFaninsNew->pArray[i] );
    // free the arrays
    if ( p->vSops      ) Vec_PtrFree( p->vSops      );
    if ( p->vSopsNew   ) Vec_PtrFree( p->vSopsNew   );
    if ( p->vFanins    ) Vec_PtrFree( p->vFanins    );
    if ( p->vFaninsNew ) Vec_PtrFree( p->vFaninsNew );
//    ABC_FREE( p );
}